

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_node * fy_node_sequence_remove(fy_node *fyn_seq,fy_node *fyn)

{
  list_head *plVar1;
  list_head *plVar2;
  _Bool _Var3;
  fy_node *pfVar4;
  
  _Var3 = fy_node_sequence_contains_node(fyn_seq,fyn);
  if (_Var3) {
    if (fyn != (fy_node *)0x0) {
      plVar1 = (fyn->node).next;
      plVar2 = (fyn->node).prev;
      plVar1->prev = plVar2;
      plVar2->next = plVar1;
      (fyn->node).next = &fyn->node;
      (fyn->node).prev = &fyn->node;
    }
    fyn->parent = (fy_node *)0x0;
    fyn->field_0x34 = fyn->field_0x34 & 0xf7;
    if (fyn_seq != (fy_node *)0x0) {
      fyn_seq->field_0x34 = fyn_seq->field_0x34 | 0x10;
      for (pfVar4 = fyn_seq->parent; pfVar4 != (fy_node *)0x0; pfVar4 = pfVar4->parent) {
        pfVar4->field_0x34 = pfVar4->field_0x34 | 0x10;
      }
    }
  }
  else {
    fyn = (fy_node *)0x0;
  }
  return fyn;
}

Assistant:

struct fy_node *fy_node_sequence_remove(struct fy_node *fyn_seq, struct fy_node *fyn) {
    if (!fy_node_sequence_contains_node(fyn_seq, fyn))
        return NULL;

    fy_node_list_del(&fyn_seq->sequence, fyn);
    fyn->parent = NULL;
    fyn->attached = false;

    fy_node_mark_synthetic(fyn_seq);

    return fyn;
}